

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::FixHoleLinkage(Clipper *this,OutRec *outRec)

{
  OutRec *pOVar1;
  OutRec *pOVar2;
  OutRec *outRec_00;
  OutRec *pOVar3;
  clipperException *this_00;
  
  pOVar3 = outRec;
  if (outRec->bottomPt != (OutPt *)0x0) {
    pOVar3 = (this->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start[outRec->bottomPt->idx];
  }
  pOVar3 = pOVar3->FirstLeft;
  if (pOVar3 == outRec) {
    this_00 = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this_00,"HoleLinkage error");
    __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
  }
  if (pOVar3 == (OutRec *)0x0) {
LAB_00666803:
    outRec->FirstLeft = (OutRec *)0x0;
  }
  else {
    pOVar1 = pOVar3->AppendLink;
    outRec_00 = pOVar3;
    while (pOVar2 = pOVar3, pOVar1 != (OutRec *)0x0) {
      pOVar1 = pOVar2->AppendLink;
      pOVar3 = pOVar1;
      outRec_00 = pOVar2;
    }
    if (outRec_00 == outRec) goto LAB_00666803;
    if (outRec_00->isHole == false) {
      outRec->FirstLeft = outRec_00;
      goto LAB_00666815;
    }
    FixHoleLinkage(this,outRec_00);
    pOVar3 = outRec_00->FirstLeft;
    outRec->FirstLeft = pOVar3;
    if (pOVar3 != (OutRec *)0x0) goto LAB_00666815;
  }
  outRec->isHole = false;
LAB_00666815:
  outRec->AppendLink = (OutRec *)0x0;
  return;
}

Assistant:

void Clipper::FixHoleLinkage(OutRec *outRec)
{
  OutRec *tmp;
  if (outRec->bottomPt)
    tmp = m_PolyOuts[outRec->bottomPt->idx]->FirstLeft;
  else
    tmp = outRec->FirstLeft;
  if (outRec == tmp) throw clipperException("HoleLinkage error");

  if (tmp)
  {
    if (tmp->AppendLink) tmp = FindAppendLinkEnd(tmp);
    if (tmp == outRec) tmp = 0;
    else if (tmp->isHole)
    {
      FixHoleLinkage(tmp);
      tmp = tmp->FirstLeft;
    }
  }
  outRec->FirstLeft = tmp;
  if (!tmp) outRec->isHole = false;
  outRec->AppendLink = 0;
}